

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QGesture_*,_QObject_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture*,QObject*>>::findNode<QGesture*>
          (Data<QHashPrivate::Node<QGesture*,QObject*>> *this,QGesture **key)

{
  byte bVar1;
  Node<QGesture_*,_QObject_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QGesture*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QGesture_*,_QObject_*> *)0x0;
  }
  else {
    pNVar2 = (Node<QGesture_*,_QObject_*> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }